

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::activation_object::get
          (value *__return_storage_ptr__,activation_object *this,wstring_view *name)

{
  gc_heap *h;
  param *ppVar1;
  object *poVar2;
  
  ppVar1 = find(this,name);
  if (ppVar1 == (param *)0x0) {
    object::get(__return_storage_ptr__,&this->super_object,name);
  }
  else {
    h = (this->super_object).heap_;
    poVar2 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->arguments_,h);
    gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&ppVar1->index_string,h);
    (**poVar2->_vptr_object)(__return_storage_ptr__,poVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

value get(const std::wstring_view& name) const override {
        if (auto p = find(name)) {
            auto& h = heap();
            return arguments_.dereference(h).get(p->index_string.dereference(h).view());
        }
        return object::get(name);
    }